

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_>::Data
          (Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *this,
          Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *other,size_t reserved)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  Node<QPlatformTextureList_*,_bool> *pNVar13;
  long lVar14;
  ulong uVar15;
  size_t numBuckets;
  long lVar16;
  long in_FS_OFFSET;
  R RVar17;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar2 = other->size;
  this->size = uVar2;
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  if (reserved < uVar2) {
    reserved = uVar2;
  }
  numBuckets = 0x80;
  if (0x40 < reserved) {
    if (reserved >> 0x3e == 0) {
      lVar14 = 0x3f;
      if (reserved != 0) {
        for (; reserved >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar14 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  this->numBuckets = numBuckets;
  RVar17 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar17.spans;
  uVar2 = other->numBuckets;
  lVar14 = 0;
  for (uVar15 = 0; uVar15 != uVar2 >> 7; uVar15 = uVar15 + 1) {
    pSVar3 = other->spans;
    for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 1) {
      bVar1 = pSVar3->offsets[lVar16 + lVar14];
      if (bVar1 != 0xff) {
        pEVar4 = pSVar3[uVar15].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = Data<QHashPrivate::Node<QPlatformTextureList*,bool>>::
                   findBucket<QPlatformTextureList*>
                             ((Data<QHashPrivate::Node<QPlatformTextureList*,bool>> *)this,
                              (QPlatformTextureList **)(pEVar4 + bVar1));
        pNVar13 = Bucket::insert(&local_48);
        pEVar4 = pEVar4 + bVar1;
        uVar5 = (pEVar4->storage).data[8];
        uVar6 = (pEVar4->storage).data[9];
        uVar7 = (pEVar4->storage).data[10];
        uVar8 = (pEVar4->storage).data[0xb];
        uVar9 = (pEVar4->storage).data[0xc];
        uVar10 = (pEVar4->storage).data[0xd];
        uVar11 = (pEVar4->storage).data[0xe];
        uVar12 = (pEVar4->storage).data[0xf];
        pNVar13->key = *(QPlatformTextureList **)(pEVar4->storage).data;
        pNVar13->value = (bool)uVar5;
        pNVar13->field_0x9 = uVar6;
        pNVar13->field_0xa = uVar7;
        pNVar13->field_0xb = uVar8;
        pNVar13->field_0xc = uVar9;
        pNVar13->field_0xd = uVar10;
        pNVar13->field_0xe = uVar11;
        pNVar13->field_0xf = uVar12;
      }
    }
    lVar14 = lVar14 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }